

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O2

CURLcode Curl_sasl_decode_digest_http_message(char *chlg,digestdata *digest)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  ushort **ppuVar4;
  char *pcVar5;
  ulong uVar6;
  byte *local_568;
  ulong local_560;
  ulong local_558;
  char *local_550;
  char *local_548;
  char *tok_buf;
  char value [256];
  char content [1024];
  
  local_548 = digest->nonce;
  local_568 = (byte *)chlg;
  Curl_sasl_digest_cleanup(digest);
  local_558 = 0;
  local_560 = 0;
  pbVar2 = local_568;
  do {
    while ((local_568 = pbVar2, bVar1 = *chlg, (ulong)bVar1 != 0 &&
           (ppuVar4 = __ctype_b_loc(),
           (*(byte *)((long)*ppuVar4 + (ulong)bVar1 * 2 + 1) & 0x20) != 0))) {
      chlg = (char *)((byte *)chlg + 1);
      pbVar2 = local_568;
    }
    local_568 = (byte *)chlg;
    iVar3 = Curl_sasl_digest_get_pair(chlg,value,content,(char **)&local_568);
    if (iVar3 != 0) {
      if ((local_548 != (char *)0x0) && (digest->stale != true)) {
        return CURLE_BAD_CONTENT_ENCODING;
      }
      if (digest->nonce != (char *)0x0) {
        return CURLE_OK;
      }
      return CURLE_BAD_CONTENT_ENCODING;
    }
    iVar3 = Curl_raw_equal(value,"nonce");
    if (iVar3 != 0) {
      pcVar5 = (*Curl_cstrdup)(content);
      digest->nonce = pcVar5;
      goto LAB_0045e4cd;
    }
    iVar3 = Curl_raw_equal(value,"stale");
    if (iVar3 != 0) {
      iVar3 = Curl_raw_equal(content,"true");
      chlg = (char *)local_568;
      if (iVar3 != 0) {
        digest->stale = true;
        digest->nc = 1;
      }
      goto LAB_0045e4da;
    }
    iVar3 = Curl_raw_equal(value,"realm");
    if (iVar3 == 0) {
      iVar3 = Curl_raw_equal(value,"opaque");
      if (iVar3 != 0) {
        pcVar5 = (*Curl_cstrdup)(content);
        digest->opaque = pcVar5;
        goto LAB_0045e4cd;
      }
      iVar3 = Curl_raw_equal(value,"qop");
      if (iVar3 != 0) {
        local_550 = (*Curl_cstrdup)(content);
        if (local_550 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        pcVar5 = strtok_r(local_550,",",&tok_buf);
        uVar6 = local_558;
        while (pcVar5 != (char *)0x0) {
          iVar3 = Curl_raw_equal(pcVar5,"auth");
          if (iVar3 == 0) {
            iVar3 = Curl_raw_equal(pcVar5,"auth-int");
            local_560 = CONCAT71((int7)(local_560 >> 8),(byte)local_560 | iVar3 != 0);
          }
          else {
            uVar6 = CONCAT71((int7)(uVar6 >> 8),1);
          }
          pcVar5 = strtok_r((char *)0x0,",",&tok_buf);
        }
        (*Curl_cfree)(local_550);
        local_558 = uVar6;
        if ((uVar6 & 1) == 0) {
          chlg = (char *)local_568;
          if ((local_560 & 1) == 0) goto LAB_0045e4da;
          pcVar5 = "auth-int";
        }
        else {
          pcVar5 = "auth";
        }
        pcVar5 = (*Curl_cstrdup)(pcVar5);
        digest->qop = pcVar5;
        goto LAB_0045e4cd;
      }
      iVar3 = Curl_raw_equal(value,"algorithm");
      chlg = (char *)local_568;
      if (iVar3 != 0) {
        pcVar5 = (*Curl_cstrdup)(content);
        digest->algorithm = pcVar5;
        if (pcVar5 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        iVar3 = Curl_raw_equal(content,"MD5-sess");
        if (iVar3 == 0) {
          iVar3 = Curl_raw_equal(content,"MD5");
          if (iVar3 == 0) {
            return CURLE_BAD_CONTENT_ENCODING;
          }
          digest->algo = 0;
          chlg = (char *)local_568;
        }
        else {
          digest->algo = 1;
          chlg = (char *)local_568;
        }
      }
    }
    else {
      pcVar5 = (*Curl_cstrdup)(content);
      digest->realm = pcVar5;
LAB_0045e4cd:
      chlg = (char *)local_568;
      if (pcVar5 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
LAB_0045e4da:
    while( true ) {
      bVar1 = *chlg;
      pbVar2 = (byte *)chlg;
      if ((ulong)bVar1 == 0) break;
      ppuVar4 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar4 + (ulong)bVar1 * 2 + 1) & 0x20) == 0) {
        pbVar2 = (byte *)chlg;
        if (bVar1 == 0x2c) {
          chlg = (char *)((byte *)chlg + 1);
          pbVar2 = (byte *)chlg;
        }
        break;
      }
      chlg = (char *)((byte *)chlg + 1);
    }
  } while( true );
}

Assistant:

CURLcode Curl_sasl_decode_digest_http_message(const char *chlg,
                                              struct digestdata *digest)
{
  bool before = FALSE; /* got a nonce before */
  bool foundAuth = FALSE;
  bool foundAuthInt = FALSE;
  char *token = NULL;
  char *tmp = NULL;

  /* If we already have received a nonce, keep that in mind */
  if(digest->nonce)
    before = TRUE;

  /* Clean up any former leftovers and initialise to defaults */
  Curl_sasl_digest_cleanup(digest);

  for(;;) {
    char value[DIGEST_MAX_VALUE_LENGTH];
    char content[DIGEST_MAX_CONTENT_LENGTH];

    /* Pass all additional spaces here */
    while(*chlg && ISSPACE(*chlg))
      chlg++;

    /* Extract a value=content pair */
    if(!Curl_sasl_digest_get_pair(chlg, value, content, &chlg)) {
      if(Curl_raw_equal(value, "nonce")) {
        digest->nonce = strdup(content);
        if(!digest->nonce)
          return CURLE_OUT_OF_MEMORY;
      }
      else if(Curl_raw_equal(value, "stale")) {
        if(Curl_raw_equal(content, "true")) {
          digest->stale = TRUE;
          digest->nc = 1; /* we make a new nonce now */
        }
      }
      else if(Curl_raw_equal(value, "realm")) {
        digest->realm = strdup(content);
        if(!digest->realm)
          return CURLE_OUT_OF_MEMORY;
      }
      else if(Curl_raw_equal(value, "opaque")) {
        digest->opaque = strdup(content);
        if(!digest->opaque)
          return CURLE_OUT_OF_MEMORY;
      }
      else if(Curl_raw_equal(value, "qop")) {
        char *tok_buf;
        /* Tokenize the list and choose auth if possible, use a temporary
            clone of the buffer since strtok_r() ruins it */
        tmp = strdup(content);
        if(!tmp)
          return CURLE_OUT_OF_MEMORY;

        token = strtok_r(tmp, ",", &tok_buf);
        while(token != NULL) {
          if(Curl_raw_equal(token, DIGEST_QOP_VALUE_STRING_AUTH)) {
            foundAuth = TRUE;
          }
          else if(Curl_raw_equal(token, DIGEST_QOP_VALUE_STRING_AUTH_INT)) {
            foundAuthInt = TRUE;
          }
          token = strtok_r(NULL, ",", &tok_buf);
        }

        free(tmp);

        /* Select only auth or auth-int. Otherwise, ignore */
        if(foundAuth) {
          digest->qop = strdup(DIGEST_QOP_VALUE_STRING_AUTH);
          if(!digest->qop)
            return CURLE_OUT_OF_MEMORY;
        }
        else if(foundAuthInt) {
          digest->qop = strdup(DIGEST_QOP_VALUE_STRING_AUTH_INT);
          if(!digest->qop)
            return CURLE_OUT_OF_MEMORY;
        }
      }
      else if(Curl_raw_equal(value, "algorithm")) {
        digest->algorithm = strdup(content);
        if(!digest->algorithm)
          return CURLE_OUT_OF_MEMORY;

        if(Curl_raw_equal(content, "MD5-sess"))
          digest->algo = CURLDIGESTALGO_MD5SESS;
        else if(Curl_raw_equal(content, "MD5"))
          digest->algo = CURLDIGESTALGO_MD5;
        else
          return CURLE_BAD_CONTENT_ENCODING;
      }
      else {
        /* unknown specifier, ignore it! */
      }
    }
    else
      break; /* we're done here */

    /* Pass all additional spaces here */
    while(*chlg && ISSPACE(*chlg))
      chlg++;

    /* Allow the list to be comma-separated */
    if(',' == *chlg)
      chlg++;
  }

  /* We had a nonce since before, and we got another one now without
     'stale=true'. This means we provided bad credentials in the previous
     request */
  if(before && !digest->stale)
    return CURLE_BAD_CONTENT_ENCODING;

  /* We got this header without a nonce, that's a bad Digest line! */
  if(!digest->nonce)
    return CURLE_BAD_CONTENT_ENCODING;

  return CURLE_OK;
}